

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteAllTarget
          (cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *generators,
          string *all_target)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  undefined4 extraout_var;
  string *psVar6;
  _Base_ptr p_Var7;
  char *val;
  cmGlobalGhsMultiGenerator *pcVar8;
  cmGlobalGhsMultiGenerator *this_01;
  pointer ppcVar9;
  cmGeneratorTarget *t;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> defaultTargets;
  cmGeneratorTarget *t_1;
  string fname;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  TargetDependSet projectTargets;
  TargetDependSet originalTargets;
  string local_2e0;
  OrderedTargetDependSet sortedProjectTargets;
  cmGeneratedFileStream fbld;
  
  ppcVar2 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ProjectTargets).
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar2) {
    (this->ProjectTargets).
    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar2;
  }
  cmLocalGenerator::GetProjectName_abi_cxx11_(&fname,root);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &originalTargets,&fname,".");
  iVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x17])(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &projectTargets,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &originalTargets,(char *)CONCAT44(extraout_var,iVar4));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sortedProjectTargets,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &projectTargets,".tgt");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbld,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sortedProjectTargets,FILE_EXTENSION);
  std::__cxx11::string::operator=((string *)all_target,(string *)&fbld);
  std::__cxx11::string::~string((string *)&fbld);
  std::__cxx11::string::~string((string *)&sortedProjectTargets);
  std::__cxx11::string::~string((string *)&projectTargets);
  std::__cxx11::string::~string((string *)&originalTargets);
  std::__cxx11::string::~string((string *)&fname);
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbld,psVar6,
                 "/CMakeFiles/");
  std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbld,
                 all_target);
  std::__cxx11::string::~string((string *)&fbld);
  cmGeneratedFileStream::cmGeneratedFileStream(&fbld,&fname,false,None);
  pcVar8 = (cmGlobalGhsMultiGenerator *)&fbld;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar8,true);
  WriteFileHeader(pcVar8,(ostream *)&fbld);
  GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)&fbld);
  projectTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_left =
       &projectTargets.
        super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t.
        _M_impl.super__Rb_tree_header._M_header;
  projectTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_color = _S_red;
  projectTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  projectTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_node_count = 0;
  originalTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_left =
       &originalTargets.
        super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t.
        _M_impl.super__Rb_tree_header._M_header;
  originalTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_color = _S_red;
  originalTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  originalTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_node_count = 0;
  projectTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_right =
       projectTargets.
       super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t.
       _M_impl.super__Rb_tree_header._M_header._M_left;
  originalTargets.
  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_right =
       originalTargets.
       super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>._M_t.
       _M_impl.super__Rb_tree_header._M_header._M_left;
  cmGlobalGenerator::GetTargetSets
            (&this->super_cmGlobalGenerator,&projectTargets,&originalTargets,root,generators);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t,"",(allocator<char> *)&t_1);
  OrderedTargetDependSet::OrderedTargetDependSet(&sortedProjectTargets,&projectTargets,(string *)&t)
  ;
  std::__cxx11::string::~string((string *)&t);
  defaultTargets.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  defaultTargets.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  defaultTargets.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &sortedProjectTargets.
            super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
            ._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = sortedProjectTargets.
                super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    t = *(cmGeneratorTarget **)(p_Var7 + 1);
    std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
              (&this->ProjectTargets,&t);
  }
  for (p_Var7 = sortedProjectTargets.
                super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    t_1 = *(cmGeneratorTarget **)(p_Var7 + 1);
    TVar5 = cmGeneratorTarget::GetType(t_1);
    this_00 = t_1;
    if (TVar5 != INTERFACE_LIBRARY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&t,"EXCLUDE_FROM_ALL",(allocator<char> *)&local_2e0);
      val = cmGeneratorTarget::GetProperty(this_00,(string *)&t);
      bVar3 = cmSystemTools::IsOn(val);
      std::__cxx11::string::~string((string *)&t);
      if (!bVar3) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&defaultTargets,&t_1);
      }
    }
  }
  build.super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  build.super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  build.super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = ComputeTargetBuildOrder(this,&defaultTargets,&build);
  if (bVar3) {
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_2e0,root);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_1,
                   "The inter-target dependency graph for project [",&local_2e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_1,
                   "] had a cycle.\n");
    std::__cxx11::string::~string((string *)&t_1);
    std::__cxx11::string::~string((string *)&local_2e0);
    cmSystemTools::Error((string *)&t);
  }
  else {
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
    std::__cxx11::string::string((string *)&t,(string *)psVar6);
    std::__cxx11::string::append((char *)&t);
    ppcVar2 = build.
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar9 = build.
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar2;
        ppcVar9 = ppcVar9 + 1) {
      pcVar8 = (cmGlobalGhsMultiGenerator *)*ppcVar9;
      TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)pcVar8);
      if (TVar5 != INTERFACE_LIBRARY) {
        TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)pcVar8);
        if (TVar5 != MODULE_LIBRARY) {
          this_01 = pcVar8;
          TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)pcVar8);
          if (TVar5 != SHARED_LIBRARY) {
            WriteProjectLine(this_01,(ostream *)&fbld,(cmGeneratorTarget *)pcVar8,root,(string *)&t)
            ;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&t);
  cmGeneratedFileStream::Close(&fbld);
  std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
  ~_Vector_base(&build.
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               );
  std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
  ~_Vector_base(&defaultTargets.
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               );
  std::
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  ::~_Rb_tree((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
               *)&sortedProjectTargets);
  std::
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
  ::~_Rb_tree((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               *)&originalTargets);
  std::
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
  ::~_Rb_tree((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               *)&projectTargets);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fbld);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteAllTarget(
  cmLocalGenerator* root, std::vector<cmLocalGenerator*>& generators,
  std::string& all_target)
{
  this->ProjectTargets.clear();

  // create target build file
  all_target = root->GetProjectName() + "." + this->GetAllTargetName() +
    ".tgt" + FILE_EXTENSION;
  std::string fname =
    root->GetCurrentBinaryDirectory() + "/CMakeFiles/" + all_target;
  cmGeneratedFileStream fbld(fname);
  fbld.SetCopyIfDifferent(true);
  this->WriteFileHeader(fbld);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);

  // Collect all targets under this root generator and the transitive
  // closure of their dependencies.
  TargetDependSet projectTargets;
  TargetDependSet originalTargets;
  this->GetTargetSets(projectTargets, originalTargets, root, generators);
  OrderedTargetDependSet sortedProjectTargets(projectTargets, "");
  std::vector<cmGeneratorTarget const*> defaultTargets;
  for (cmGeneratorTarget const* t : sortedProjectTargets) {
    /* save list of all targets in sorted order */
    this->ProjectTargets.push_back(t);
  }
  for (cmGeneratorTarget const* t : sortedProjectTargets) {
    if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (!cmSystemTools::IsOn(t->GetProperty("EXCLUDE_FROM_ALL"))) {
      defaultTargets.push_back(t);
    }
  }
  std::vector<cmGeneratorTarget const*> build;
  if (ComputeTargetBuildOrder(defaultTargets, build)) {
    std::string message = "The inter-target dependency graph for project [" +
      root->GetProjectName() + "] had a cycle.\n";
    cmSystemTools::Error(message);
  } else {
    // determine the targets for ALL target
    std::string rootBinaryDir = root->GetCurrentBinaryDirectory();
    rootBinaryDir += "/CMakeFiles";
    for (cmGeneratorTarget const* target : build) {
      if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          target->GetType() == cmStateEnums::MODULE_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        continue;
      }
      this->WriteProjectLine(fbld, target, root, rootBinaryDir);
    }
  }
  fbld.Close();
}